

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall
ON_DimStyle::SetUnitSystemFromContext
          (ON_DimStyle *this,bool bUseName,LengthUnitSystem source_unit_system,
          LengthUnitSystem destination_unit_system)

{
  ON_UUID id_00;
  uint uVar1;
  LengthUnitSystem LVar2;
  bool bVar3;
  LengthUnitSystem LVar4;
  uint uVar5;
  ON_NameHash *pOVar6;
  ON_DimStyle *pOVar7;
  ON_UUID *pOVar8;
  uchar auVar9 [8];
  wchar_t *pwVar10;
  uchar string2 [8];
  LengthUnitSystem LVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  ON_wString unit_name;
  ON_wString dim_style_name;
  ON_SimpleArray<ON_LengthUnitName> name_list;
  ON_UUID id;
  ON_NameHash name_hash;
  ON_wString local_c0;
  ON_wString in_stack_ffffffffffffff48;
  uchar in_stack_ffffffffffffff50 [8];
  ON_UUID_struct local_88;
  uchar local_70 [8];
  uchar local_68 [8];
  uchar local_60 [8];
  ON_NameHash local_58;
  
  LVar2 = this->m_dimstyle_unitsystem;
  uVar12 = 0;
  if ((LVar2 != CustomUnits) && (uVar12 = 0, LVar2 != Unset)) {
    uVar12 = (uint)LVar2;
  }
  LVar2 = ON::LengthUnitSystemFromUnsigned(uVar12);
  if (((LVar2 == None) || (LVar2 == Unset)) || (LVar2 == CustomUnits)) {
    LVar2 = None;
  }
  bVar15 = LVar2 == None;
  if (bVar15) {
    local_68 = (uchar  [8])&PTR__ON_SimpleArray_0081e1b8;
    uVar12 = 0;
    do {
      if (uVar12 == 0 && !bUseName) {
LAB_00457209:
        LVar2 = None;
      }
      else if (uVar12 - 1 < 2) {
        LVar4 = destination_unit_system;
        if (uVar12 == 1) {
          LVar4 = source_unit_system;
        }
        bVar15 = ON::IsUnitedStatesPrinterLengthUnit(LVar4);
        LVar2 = LVar4;
        if (!bVar15) {
          bVar15 = ON::IsTerrestrialLengthUnit(LVar4);
          if (!bVar15) goto LAB_00457209;
          bVar15 = ON::IsUnitedStatesCustomaryLengthUnit(LVar4);
          LVar2 = Inches;
          if (!bVar15) {
            bVar15 = ON::IsMetricLengthUnit(LVar4);
            LVar2 = bVar15 * '\x02';
          }
        }
      }
      else {
        if (uVar12 != 0) goto LAB_00457209;
        pOVar6 = ON_ModelComponent::NameHash(&this->super_ON_ModelComponent);
        local_58.m_flags = pOVar6->m_flags;
        local_58.m_sha1_hash.m_digest[0] = (pOVar6->m_sha1_hash).m_digest[0];
        local_58.m_sha1_hash.m_digest[1] = (pOVar6->m_sha1_hash).m_digest[1];
        local_58.m_sha1_hash.m_digest[2] = (pOVar6->m_sha1_hash).m_digest[2];
        local_58.m_sha1_hash.m_digest[3] = (pOVar6->m_sha1_hash).m_digest[3];
        local_58.m_sha1_hash.m_digest._4_8_ = *(undefined8 *)((pOVar6->m_sha1_hash).m_digest + 4);
        local_58.m_sha1_hash.m_digest._12_8_ = *(undefined8 *)((pOVar6->m_sha1_hash).m_digest + 0xc)
        ;
        local_58.m_parent_id.Data1 = (pOVar6->m_parent_id).Data1;
        local_58.m_parent_id.Data2 = (pOVar6->m_parent_id).Data2;
        local_58.m_parent_id.Data3 = (pOVar6->m_parent_id).Data3;
        local_58.m_parent_id.Data4 = *&(pOVar6->m_parent_id).Data4;
        bVar15 = ON_NameHash::IsValidAndNotEmpty(&local_58);
        if (bVar15) {
          pOVar7 = SystemDimstyleFromName(&local_58);
          pOVar6 = ON_ModelComponent::NameHash(&pOVar7->super_ON_ModelComponent);
          bVar3 = ::operator==(&local_58,pOVar6);
          bVar15 = true;
          if (bVar3) {
            pOVar6 = ON_ModelComponent::NameHash(&Default.super_ON_ModelComponent);
            bVar3 = ::operator!=(&local_58,pOVar6);
            if (!bVar3) goto LAB_00457230;
            LVar4 = pOVar7->m_dimstyle_unitsystem;
            bVar15 = false;
            if (LVar4 == CustomUnits) goto LAB_00457230;
            LVar2 = None;
            if (LVar4 != Unset) {
              bVar15 = false;
              LVar2 = LVar4;
            }
          }
          else {
LAB_00457230:
            LVar2 = None;
          }
          if (!bVar15) goto LAB_0045720c;
        }
        else {
          LVar2 = None;
        }
        pOVar8 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
        local_88.Data1 = pOVar8->Data1;
        local_88.Data2 = pOVar8->Data2;
        local_88.Data3 = pOVar8->Data3;
        local_88.Data4 = *&pOVar8->Data4;
        bVar15 = ::operator!=(&ON_nil_uuid,&local_88);
        if (bVar15) {
          id_00.Data4[0] = in_stack_ffffffffffffff50[0];
          id_00.Data4[1] = in_stack_ffffffffffffff50[1];
          id_00.Data4[2] = in_stack_ffffffffffffff50[2];
          id_00.Data4[3] = in_stack_ffffffffffffff50[3];
          id_00.Data4[4] = in_stack_ffffffffffffff50[4];
          id_00.Data4[5] = in_stack_ffffffffffffff50[5];
          id_00.Data4[6] = in_stack_ffffffffffffff50[6];
          id_00.Data4[7] = in_stack_ffffffffffffff50[7];
          id_00._0_8_ = in_stack_ffffffffffffff48.m_s;
          pOVar7 = SystemDimstyleFromId(id_00);
          pOVar8 = ON_ModelComponent::Id(&pOVar7->super_ON_ModelComponent);
          bVar3 = ::operator==(&local_88,pOVar8);
          bVar15 = true;
          if (bVar3) {
            pOVar8 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
            bVar3 = ::operator!=(&local_88,pOVar8);
            if (bVar3) {
              LVar4 = pOVar7->m_dimstyle_unitsystem;
              bVar15 = false;
              if (LVar4 == CustomUnits) {
                LVar2 = None;
              }
              else {
                bVar15 = false;
                LVar2 = None;
                if (LVar4 != Unset) {
                  bVar15 = false;
                  LVar2 = LVar4;
                }
              }
            }
          }
          if (!bVar15) goto LAB_0045720c;
        }
        ON_ModelComponent::Name((ON_ModelComponent *)&stack0xffffffffffffff48);
        ON_wString::TrimLeftAndRight((ON_wString *)&stack0xffffffffffffff48,(wchar_t *)0x0);
        ON_wString::MakeLowerOrdinal((ON_wString *)&stack0xffffffffffffff48);
        bVar15 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffff48);
        if (((!bVar15) &&
            (auVar9._0_4_ = ON_wString::Length((ON_wString *)&stack0xffffffffffffff48),
            0 < (int)auVar9._0_4_)) &&
           (uVar5 = ON_LengthUnitName::GetLengthUnitNameList(0,(ON_LengthUnitName *)0x0), uVar5 != 0
           )) {
          in_stack_ffffffffffffff50 = local_68;
          ON_SimpleArray<ON_LengthUnitName>::SetCapacity
                    ((ON_SimpleArray<ON_LengthUnitName> *)&stack0xffffffffffffff50,(ulong)uVar5);
          uVar1 = 0;
          if ((-1 < (int)uVar5) && ((int)uVar5 < 1)) {
            uVar1 = uVar5;
          }
          ON_LengthUnitName::GetLengthUnitNameList((ulong)uVar1,(ON_LengthUnitName *)0x0);
          if (uVar1 != 0) {
            auVar9[4] = '\0';
            auVar9[5] = '\0';
            auVar9[6] = '\0';
            auVar9[7] = '\0';
            uVar13 = 0;
            local_70 = auVar9;
            do {
              LVar4 = ON_LengthUnitName::LengthUnit((ON_LengthUnitName *)(uVar13 * 0x10));
              bVar15 = ON::IsTerrestrialLengthUnit(LVar4);
              iVar14 = 9;
              if ((bVar15) &&
                 ((bVar15 = ON::IsMetricLengthUnit(LVar4), bVar15 ||
                  (bVar15 = ON::IsUnitedStatesCustomaryLengthUnit(LVar4), bVar15)))) {
                pwVar10 = ON_LengthUnitName::LengthUnitName((ON_LengthUnitName *)(uVar13 * 0x10));
                ON_wString::ON_wString(&local_c0,pwVar10);
                ON_wString::TrimLeftAndRight(&local_c0,(wchar_t *)0x0);
                ON_wString::MakeLowerOrdinal(&local_c0);
                bVar15 = ON_wString::IsEmpty(&local_c0);
                iVar14 = 9;
                if ((!bVar15) &&
                   (uVar5 = ON_wString::Length(&local_c0),
                   (int)uVar5 <= (int)auVar9._0_4_ && 0 < (int)uVar5)) {
                  string2 = (uchar  [8])
                            ON_wString::operator_cast_to_wchar_t_
                                      ((ON_wString *)&stack0xffffffffffffff48);
                  local_60 = (uchar  [8])
                             ((wchar_t *)((long)string2 + (long)local_70 * 4) + -(ulong)uVar5);
                  if ((ulong)string2 <= (ulong)local_60) {
                    do {
                      pwVar10 = ON_wString::operator_cast_to_wchar_t_(&local_c0);
                      bVar15 = ON_wString::EqualOrdinal
                                         (pwVar10,uVar5,(wchar_t *)string2,uVar5,false);
                      if (bVar15) {
                        bVar15 = ON::IsUnitedStatesCustomaryLengthUnit(LVar4);
                        LVar2 = Millimeters;
                        if (bVar15) {
                          LVar2 = Inches;
                        }
                        break;
                      }
                      string2 = (uchar  [8])((long)string2 + 4);
                    } while ((ulong)string2 <= (ulong)local_60);
                  }
                  iVar14 = 7;
                  if (LVar2 == None) {
                    iVar14 = 0;
                  }
                }
                ON_wString::~ON_wString(&local_c0);
              }
            } while (((iVar14 == 9) || (iVar14 == 0)) && (uVar13 = uVar13 + 1, uVar13 < uVar1));
          }
          ON_SimpleArray<ON_LengthUnitName>::~ON_SimpleArray
                    ((ON_SimpleArray<ON_LengthUnitName> *)&stack0xffffffffffffff50);
        }
        ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff48);
      }
LAB_0045720c:
      bVar15 = LVar2 == None;
    } while ((uVar12 < 2) && (uVar12 = uVar12 + 1, LVar2 == None));
  }
  LVar4 = Millimeters;
  if (!bVar15) {
    LVar4 = LVar2;
  }
  LVar2 = this->m_dimstyle_unitsystem;
  LVar11 = None;
  if ((LVar2 != CustomUnits) && (LVar11 = None, LVar2 != Unset)) {
    LVar11 = LVar2;
  }
  if (LVar4 != LVar11) {
    SetUnitSystem(this,LVar4);
  }
  return;
}

Assistant:

void ON_DimStyle::SetUnitSystemFromContext(
  bool bUseName,
  ON::LengthUnitSystem source_unit_system,
  ON::LengthUnitSystem destination_unit_system
)
{
  /// NOTE WELL: A dimstyle unit system was added in V6, but has never been fully used.
  /// The idea was this would make it easier to figure out what text height/ arrow size, 
  /// ... actually meant. Especially in situations where model space and page space have
  /// different unit systems, and in more complex cases like text in instance definitions
  /// and inserting annotation from models with mismatched unit systems.
  /// It is used internally to get some scales properly set and use in limited
  /// merging contexts.
  ///   
  /// From a user's perspective, in Rhino 6 and Rhino 7 ON_DimStyle lengths like TextHeight(), ArrowSize(), ... 
  /// are with respect to the context the annotation resides in. For example, if TextHeight() = 3.5,
  /// model units = meters, page units = millimeters, and DimScale() = 1, then
  /// text created in model space will be 3.5 meters high and
  /// text created in page space will be 3.5 millimeters high.
  /// 
  /// Ideally, ON_DimStyle::UnitSystem() would specify the text height units 
  /// and ON_DimStyle::DimScale() could be adjusted as model space extents require.
  /// Text in instance definitions would have a well defined height and references
  /// to those instance definitions would display predictably in both model space and page space.


  ON::LengthUnitSystem dim_style_units = ON::LengthUnitSystemFromUnsigned(static_cast<unsigned int>(UnitSystem()));

  switch (dim_style_units)
  {
    case ON::LengthUnitSystem::None:
    case ON::LengthUnitSystem::CustomUnits:
    case ON::LengthUnitSystem::Unset:
      dim_style_units = ON::LengthUnitSystem::None;
      break;
    default:
      break;
  }
  
  for (int pass = 0; pass < 3; pass++)
  {
    if (ON::LengthUnitSystem::None != dim_style_units)
      break;
    if (0 == pass && false == bUseName)
      continue;
    switch (pass)
    {
    case 0: // search dimstyle name for metric or United States customary unit system names
      {
        const ON_NameHash name_hash = NameHash();
        if (name_hash.IsValidAndNotEmpty())
        {
          const ON_DimStyle& from_name = ON_DimStyle::SystemDimstyleFromName(name_hash);
          if (name_hash == from_name.NameHash() && name_hash != ON_DimStyle::Default.NameHash())
          {
            dim_style_units = from_name.UnitSystem();
            continue;
          }
        }
    
        const ON_UUID id = Id();
        if (ON_nil_uuid != id )
        {
          const ON_DimStyle& from_id = ON_DimStyle::SystemDimstyleFromId(id);
          if (id == from_id.Id() && id != ON_DimStyle::Default.Id() )
          {
            dim_style_units = from_id.UnitSystem();
            continue;
          }
        }

        ON_wString dim_style_name = Name();
        dim_style_name.TrimLeftAndRight();
        dim_style_name.MakeLowerOrdinal();
        if (dim_style_name.IsEmpty())
          break;
        const int dim_style_name_length = dim_style_name.Length();
        if (dim_style_name_length <= 0)
          break;

        const size_t name_list_capacity = ON_LengthUnitName::GetLengthUnitNameList(0, nullptr);
        if (name_list_capacity <= 0)
          break;

        ON_SimpleArray<ON_LengthUnitName> name_list(name_list_capacity);
        name_list.SetCount((int)name_list_capacity);
        ON_LengthUnitName::GetLengthUnitNameList(name_list.UnsignedCount(), name_list.Array());
        
        for (unsigned int i = 0; i < name_list.UnsignedCount(); i++)
        {
          ON::LengthUnitSystem name_us = name_list[i].LengthUnit();
          if (false == ON::IsTerrestrialLengthUnit(name_us))
            continue;
          if (
            false == ON::IsMetricLengthUnit(name_us)
            && false == ON::IsUnitedStatesCustomaryLengthUnit(name_us) 
            )
            continue;
          ON_wString unit_name = name_list[i].LengthUnitName();
          unit_name.TrimLeftAndRight();
          unit_name.MakeLowerOrdinal();
          if (unit_name.IsEmpty())
            continue;
          const int name_length = unit_name.Length();
          if (name_length <= 0)
            continue;
          if (name_length > dim_style_name_length )
            continue;

          const wchar_t* s = static_cast<const wchar_t*>(dim_style_name);
          const wchar_t* s1 = s + dim_style_name_length - name_length;
          for (/*empty init*/; s <= s1; s++)
          {
            if (ON_wString::EqualOrdinal(static_cast<const wchar_t*>(unit_name), name_length, s, name_length, false))
            {
              if (ON::IsUnitedStatesCustomaryLengthUnit(name_us))
                dim_style_units = ON::LengthUnitSystem::Inches;
              else
                dim_style_units = ON::LengthUnitSystem::Millimeters;
              break;
            }
          }
          if (ON::LengthUnitSystem::None != dim_style_units)
            break;
        }
      }
      break;

    case 1:
    case 2:
      {
        const ON::LengthUnitSystem context_us
          = (1 == pass)
          ? source_unit_system
          : destination_unit_system;
        if (ON::IsUnitedStatesPrinterLengthUnit(context_us))
          dim_style_units = context_us;
        else if (ON::IsTerrestrialLengthUnit(context_us))
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Inches;
          else if (ON::IsMetricLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Millimeters;
        }
      }
      break;
    }
  }

  if (ON::LengthUnitSystem::None == dim_style_units)
    dim_style_units = ON::LengthUnitSystem::Millimeters;

  if( dim_style_units != UnitSystem() )
    SetUnitSystem(dim_style_units);

  return;
}